

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall
CTcEmbedBuilderDbl::add_embedding(CTcEmbedBuilderDbl *this,CTcPrsNode *cur,CTcPrsNode *sub)

{
  CTcPrsNode *rhs;
  long in_RSI;
  CTcPrsNode *in_stack_ffffffffffffffb8;
  CTPNDstrEmbed *in_stack_ffffffffffffffc0;
  CTPNComma *in_stack_ffffffffffffffd0;
  CTcPrsNode *local_8;
  
  local_8 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x2b71cd);
  CTPNDstrEmbed::CTPNDstrEmbed(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (in_RSI != 0) {
    rhs = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x2b7200);
    CTPNComma::CTPNComma(in_stack_ffffffffffffffd0,local_8,rhs);
    local_8 = rhs;
  }
  return local_8;
}

Assistant:

virtual CTcPrsNode *add_embedding(CTcPrsNode *cur, CTcPrsNode *sub)
    {
        /* wrap the expresion in a "say()" embedding node */
        sub = new CTPNDstrEmbed(sub);
        
        /*
         *   Build a node representing everything so far: do this by
         *   combining the sub-expression with everything preceding, using a
         *   comma operator.  This isn't necessary if there's nothing
         *   preceding the sub-expression, since this means the
         *   sub-expression itself is everything so far.  
         */
        if (cur != 0)
            return new CTPNComma(cur, sub);
        else
            return sub;
    }